

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O0

void __thiscall
Assimp::PretransformVertices::SetupProperties(PretransformVertices *this,Importer *pImp)

{
  Importer *this_00;
  bool bVar1;
  int iVar2;
  aiMatrix4x4t<float> local_98;
  aiMatrix4x4 local_58;
  Importer *local_18;
  Importer *pImp_local;
  PretransformVertices *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  iVar2 = Importer::GetPropertyInteger(pImp,"PP_PTV_KEEP_HIERARCHY",0);
  this->configKeepHierarchy = iVar2 != 0;
  iVar2 = Importer::GetPropertyInteger(local_18,"PP_PTV_NORMALIZE",0);
  this->configNormalize = iVar2 != 0;
  iVar2 = Importer::GetPropertyInteger(local_18,"PP_PTV_ADD_ROOT_TRANSFORMATION",0);
  this_00 = local_18;
  this->configTransform = iVar2 != 0;
  aiMatrix4x4t<float>::aiMatrix4x4t(&local_98);
  Importer::GetPropertyMatrix(&local_58,this_00,"PP_PTV_ROOT_TRANSFORMATION",&local_98);
  memcpy(&this->configTransformation,&local_58,0x40);
  bVar1 = Importer::GetPropertyBool(local_18,"EXPORT_POINT_CLOUDS",false);
  this->mConfigPointCloud = bVar1;
  return;
}

Assistant:

void PretransformVertices::SetupProperties(const Importer *pImp) {
	// Get the current value of AI_CONFIG_PP_PTV_KEEP_HIERARCHY, AI_CONFIG_PP_PTV_NORMALIZE,
	// AI_CONFIG_PP_PTV_ADD_ROOT_TRANSFORMATION and AI_CONFIG_PP_PTV_ROOT_TRANSFORMATION
	configKeepHierarchy = (0 != pImp->GetPropertyInteger(AI_CONFIG_PP_PTV_KEEP_HIERARCHY, 0));
	configNormalize = (0 != pImp->GetPropertyInteger(AI_CONFIG_PP_PTV_NORMALIZE, 0));
	configTransform = (0 != pImp->GetPropertyInteger(AI_CONFIG_PP_PTV_ADD_ROOT_TRANSFORMATION, 0));

	configTransformation = pImp->GetPropertyMatrix(AI_CONFIG_PP_PTV_ROOT_TRANSFORMATION, aiMatrix4x4());

	mConfigPointCloud = pImp->GetPropertyBool(AI_CONFIG_EXPORT_POINT_CLOUDS);
}